

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticEngine.cpp
# Opt level: O3

void slang::getMacroArgExpansions
               (SourceManager *sm,SourceLocation loc,bool isStart,
               SmallVectorBase<slang::BufferID> *results)

{
  bool bVar1;
  SourceRange SVar2;
  BufferID local_2c;
  
  bVar1 = SourceManager::isMacroLoc(sm,loc);
  if (bVar1) {
    do {
      bVar1 = SourceManager::isMacroArgLoc(sm,loc);
      if (bVar1) {
        local_2c.id = loc._0_4_ & 0xfffffff;
        SmallVectorBase<slang::BufferID>::emplace_back<slang::BufferID>(results,&local_2c);
        loc = SourceManager::getOriginalLoc(sm,loc);
      }
      else {
        SVar2 = SourceManager::getExpansionRange(sm,loc);
        loc = SVar2.endLoc;
        if (isStart) {
          loc = SVar2.startLoc;
        }
      }
      bVar1 = SourceManager::isMacroLoc(sm,loc);
    } while (bVar1);
  }
  return;
}

Assistant:

static void getMacroArgExpansions(const SourceManager& sm, SourceLocation loc, bool isStart,
                                  SmallVectorBase<BufferID>& results) {
    while (sm.isMacroLoc(loc)) {
        if (sm.isMacroArgLoc(loc)) {
            results.push_back(loc.buffer());
            loc = sm.getOriginalLoc(loc);
        }
        else {
            auto range = sm.getExpansionRange(loc);
            loc = isStart ? range.start() : range.end();
        }
    }
}